

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

XMLCh * __thiscall
xercesc_4_0::TraverseSchema::traverseNotationDecl
          (TraverseSchema *this,DOMElement *elem,XMLCh *name,XMLCh *uriStr)

{
  SchemaInfo **enclosingSchema;
  SchemaInfo *pSVar1;
  ValueVectorOf<int> *pVVar2;
  ulong uVar3;
  SchemaInfo *pSVar4;
  RefVectorOf<xercesc_4_0::SchemaInfo> *pRVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  DOMElement *elem_00;
  XMLCh *pXVar9;
  Grammar *pGVar10;
  SchemaInfo *pSVar11;
  ulong uVar12;
  ulong uVar13;
  XMLSize_t getAt;
  XMLSize_t XVar14;
  bool bVar15;
  NamespaceScopeManager nsMgr;
  NamespaceScopeManager local_40;
  
  pSVar1 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    local_40.fScopeAdded = false;
  }
  else {
    local_40.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  local_40.fSchemaInfo = pSVar1;
  iVar7 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                    (this->fURIStringPool,uriStr);
  enclosingSchema = &this->fSchemaInfo;
  pSVar1 = this->fSchemaInfo;
  if (this->fTargetNSURI == iVar7) {
LAB_0033981f:
    elem_00 = SchemaInfo::getTopLevelComponent(*enclosingSchema,6,L"notation",name,enclosingSchema);
    if (elem_00 != (DOMElement *)0x0) {
      pXVar9 = traverseNotationDecl(this,elem_00);
      this->fSchemaInfo = pSVar1;
      this->fTargetNSURI = pSVar1->fTargetNSURI;
      goto LAB_00339977;
    }
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x81,uriStr,name,
                      (XMLCh *)0x0,(XMLCh *)0x0);
  }
  else {
    iVar7 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])();
    pVVar2 = this->fImportedNSList;
    if (pVVar2 == (ValueVectorOf<int> *)0x0) {
LAB_00339927:
      pXVar9 = (XMLCh *)0x0;
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x8e,uriStr,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      goto LAB_00339977;
    }
    uVar3 = pVVar2->fCurCount;
    bVar15 = uVar3 != 0;
    if (uVar3 == 0) {
LAB_003398e7:
      if (!bVar15) goto LAB_00339927;
    }
    else if (*pVVar2->fElemList != iVar7) {
      uVar12 = 0;
      do {
        uVar13 = uVar3;
        if (uVar3 - 1 == uVar12) break;
        uVar13 = uVar12 + 1;
        lVar6 = uVar12 + 1;
        uVar12 = uVar13;
      } while (pVVar2->fElemList[lVar6] != iVar7);
      bVar15 = uVar13 < uVar3;
      goto LAB_003398e7;
    }
    pGVar10 = GrammarResolver::getGrammar(this->fGrammarResolver,uriStr);
    if ((pGVar10 == (Grammar *)0x0) ||
       (iVar8 = (*(pGVar10->super_XSerializable)._vptr_XSerializable[5])(pGVar10), iVar8 != 1)) {
      pXVar9 = (XMLCh *)0x0;
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLValidity",0x26,uriStr,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      goto LAB_00339977;
    }
    pSVar4 = *enclosingSchema;
    pRVar5 = pSVar4->fImportedInfoList;
    if (pRVar5 == (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
      XVar14 = 0;
    }
    else {
      XVar14 = (pRVar5->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount;
    }
    if (XVar14 != 0) {
      getAt = 0;
      do {
        pSVar11 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                            (&pSVar4->fImportedInfoList->
                              super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,getAt);
        if (pSVar11->fTargetNSURI == iVar7) goto LAB_003399c3;
        getAt = getAt + 1;
      } while (XVar14 != getAt);
    }
    pSVar11 = (SchemaInfo *)0x0;
LAB_003399c3:
    if ((pSVar11 != (SchemaInfo *)0x0) && (pSVar11->fProcessed != true)) {
      this->fSchemaInfo = pSVar11;
      this->fTargetNSURI = pSVar11->fTargetNSURI;
      goto LAB_0033981f;
    }
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x28,uriStr,name,
                      (XMLCh *)0x0,(XMLCh *)0x0);
  }
  pXVar9 = (XMLCh *)0x0;
LAB_00339977:
  NamespaceScopeManager::~NamespaceScopeManager(&local_40);
  return pXVar9;
}

Assistant:

const XMLCh* TraverseSchema::traverseNotationDecl(const DOMElement* const elem,
                                                  const XMLCh* const name,
                                                  const XMLCh* const uriStr) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    unsigned int uriId = fURIStringPool->addOrFind(uriStr);
    SchemaInfo*  saveInfo = fSchemaInfo;

    if (fTargetNSURI != (int) uriId) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        unsigned int uriId = fURIStringPool->addOrFind(uriStr);

        if (!isImportingNS(uriId)) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, uriStr);
            return 0;
        }

        Grammar* grammar = fGrammarResolver->getGrammar(uriStr);

        if (grammar == 0 || grammar->getGrammarType() != Grammar::SchemaGrammarType) {

            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::GrammarNotFound, uriStr);
            return 0;
        }

        SchemaInfo* impInfo = fSchemaInfo->getImportInfo(uriId);

        if (!impInfo || impInfo->getProcessed()) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, uriStr, name);
            return 0;
        }

        fSchemaInfo = impInfo;
        fTargetNSURI = fSchemaInfo->getTargetNSURI();
    }

    DOMElement* notationElem = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_Notation,
        SchemaSymbols::fgELT_NOTATION, name, &fSchemaInfo);

    if (notationElem == 0) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::Notation_DeclNotFound, uriStr, name);
        return 0;
    }

    const XMLCh* notationName = traverseNotationDecl(notationElem);

    fSchemaInfo = saveInfo;
    fTargetNSURI = fSchemaInfo->getTargetNSURI();

    return notationName;
}